

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  uint id;
  size_t sVar1;
  bool bVar2;
  SPIRConstant *c;
  SPIRType *type;
  bool bVar3;
  long lVar4;
  LoopLock local_b0;
  size_t local_a8;
  ParsedIR *local_a0;
  TypedID<(spirv_cross::Types)0> *local_98;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_a0 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_a8 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  ParsedIR::create_loop_hard_lock(local_a0);
  local_98 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  lVar4 = 0;
  bVar3 = false;
  do {
    if (sVar1 << 2 == lVar4) {
      ParsedIR::LoopLock::~LoopLock(&local_b0);
      if (bVar3) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
      }
      return;
    }
    id = *(uint *)((long)&local_98->id + lVar4);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeConstant) {
      c = ParsedIR::get<spirv_cross::SPIRConstant>(local_a0,id);
      if (c->specialization == false) {
        type = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(c->super_IVariant).field_0xc);
        if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          if (local_a8 == 1) {
            bVar2 = Compiler::is_scalar((Compiler *)this,type);
            if (!bVar2) {
              bVar2 = Compiler::is_vector((Compiler *)this,type);
              if (!bVar2) goto LAB_00298218;
            }
          }
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&name,this,(ulong)(c->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                    (&local_70,this,type,&name,0);
          CompilerGLSL::constant_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,c);
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_70,
                     (char (*) [4])0x31e8c7,&local_50,(char (*) [2])0x304bae);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&name);
          bVar3 = true;
        }
      }
    }
LAB_00298218:
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (!type.array.empty() && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}